

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O0

uint glTF::ComponentTypeSize(ComponentType t)

{
  DeadlyImportError *this;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string err;
  ComponentType t_local;
  
  if (t - ComponentType_BYTE < 2) {
    err.field_2._12_4_ = 1;
  }
  else if (t - ComponentType_SHORT < 2) {
    err.field_2._12_4_ = 2;
  }
  else {
    if (1 < t - ComponentType_UNSIGNED_INT) {
      err.field_2._8_4_ = t;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_30,"GLTF: Unsupported Component Type ",&local_31);
      std::allocator<char>::~allocator(&local_31);
      std::__cxx11::string::operator+=((string *)local_30,err.field_2._M_local_buf[8]);
      this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this,(string *)local_30);
      __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    err.field_2._12_4_ = 4;
  }
  return err.field_2._12_4_;
}

Assistant:

inline unsigned int ComponentTypeSize(ComponentType t)
    {
        switch (t) {
            case ComponentType_SHORT:
            case ComponentType_UNSIGNED_SHORT:
                return 2;

            case ComponentType_UNSIGNED_INT:
            case ComponentType_FLOAT:
                return 4;

            case ComponentType_BYTE:
            case ComponentType_UNSIGNED_BYTE:
                return 1;
            default:
                std::string err = "GLTF: Unsupported Component Type ";
                err += t;
                throw DeadlyImportError(err);
        }
    }